

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O2

string * __thiscall
OpenMPDefaultClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPDefaultClause *this)

{
  OpenMPDirective *this_00;
  string parameter_string;
  allocator<char> local_b3;
  allocator<char> local_b2;
  allocator<char> local_b1;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"default (",(allocator<char> *)&local_90);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  switch(this->default_kind) {
  case OMPC_DEFAULT_private:
    break;
  case OMPC_DEFAULT_firstprivate:
    break;
  case OMPC_DEFAULT_shared:
    break;
  case OMPC_DEFAULT_none:
    break;
  case OMPC_DEFAULT_variant:
    this_00 = this->variant_directive;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_b1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_b2);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_b3);
    OpenMPDirective::generatePragmaString(&local_b0,this_00,&local_30,&local_50,&local_70);
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    goto LAB_0015fa22;
  default:
    std::operator<<((ostream *)&std::cout,"The parameter of default clause is not supported.\n");
    goto LAB_0015fa22;
  }
  std::__cxx11::string::assign((char *)&local_90);
LAB_0015fa22:
  if (local_90._M_string_length == 0) {
    std::__cxx11::string::substr((ulong)&local_b0,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b0);
  }
  else {
    std::operator+(&local_b0,&local_90,") ");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPDefaultClause::toString() {

    std::string result = "default (";
    std::string parameter_string;
    OpenMPDefaultClauseKind default_kind = this->getDefaultClauseKind();
    switch (default_kind) {
        case OMPC_DEFAULT_shared:
            parameter_string = "shared";
            break;
        case OMPC_DEFAULT_private:
            parameter_string = "private";
            break;
        case OMPC_DEFAULT_firstprivate:
            parameter_string = "firstprivate";
            break;
        case OMPC_DEFAULT_none:
            parameter_string = "none";
            break;
        case OMPC_DEFAULT_variant:
            parameter_string = this->getVariantDirective()->generatePragmaString("", "", "");
            break;
        default:
            std::cout << "The parameter of default clause is not supported.\n";
    };

    if (parameter_string.size() > 0) {
        result += parameter_string + ") ";
    }
    else {
        result = result.substr(0, result.size()-2);
    }

    return result;
}